

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Select * sqlite3SelectDup(sqlite3 *db,Select *p,int flags)

{
  Select *pSVar1;
  ExprList *pEVar2;
  SrcList *pSVar3;
  Expr *pEVar4;
  Select *pSVar5;
  
  if ((p != (Select *)0x0) &&
     (pSVar1 = (Select *)sqlite3DbMallocRaw(db,0x78), pSVar1 != (Select *)0x0)) {
    pEVar2 = sqlite3ExprListDup(db,p->pEList,flags);
    pSVar1->pEList = pEVar2;
    pSVar3 = sqlite3SrcListDup(db,p->pSrc,flags);
    pSVar1->pSrc = pSVar3;
    pEVar4 = exprDup(db,p->pWhere,flags,(u8 **)0x0);
    pSVar1->pWhere = pEVar4;
    pEVar2 = sqlite3ExprListDup(db,p->pGroupBy,flags);
    pSVar1->pGroupBy = pEVar2;
    pEVar4 = exprDup(db,p->pHaving,flags,(u8 **)0x0);
    pSVar1->pHaving = pEVar4;
    pEVar2 = sqlite3ExprListDup(db,p->pOrderBy,flags);
    pSVar1->pOrderBy = pEVar2;
    pSVar1->op = p->op;
    pSVar5 = sqlite3SelectDup(db,p->pPrior,flags);
    pSVar1->pPrior = pSVar5;
    if (pSVar5 != (Select *)0x0) {
      pSVar5->pNext = pSVar1;
    }
    pSVar1->pNext = (Select *)0x0;
    pEVar4 = exprDup(db,p->pLimit,flags,(u8 **)0x0);
    pSVar1->pLimit = pEVar4;
    pEVar4 = exprDup(db,p->pOffset,flags,(u8 **)0x0);
    pSVar1->pOffset = pEVar4;
    pSVar1->iLimit = 0;
    pSVar1->iOffset = 0;
    pSVar1->selFlags = p->selFlags & 0xfff7;
    pSVar1->pRightmost = (Select *)0x0;
    pSVar1->addrOpenEphm[0] = -1;
    pSVar1->addrOpenEphm[1] = -1;
    pSVar1->addrOpenEphm[2] = -1;
    return pSVar1;
  }
  return (Select *)0x0;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *p, int flags){
  Select *pNew, *pPrior;
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRaw(db, sizeof(*p) );
  if( pNew==0 ) return 0;
  pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
  pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
  pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
  pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
  pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
  pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
  pNew->op = p->op;
  pNew->pPrior = pPrior = sqlite3SelectDup(db, p->pPrior, flags);
  if( pPrior ) pPrior->pNext = pNew;
  pNew->pNext = 0;
  pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
  pNew->pOffset = sqlite3ExprDup(db, p->pOffset, flags);
  pNew->iLimit = 0;
  pNew->iOffset = 0;
  pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
  pNew->pRightmost = 0;
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->addrOpenEphm[2] = -1;
  return pNew;
}